

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmState::CreateVariableScopeSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  PositionType *this_00;
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  iterator it;
  PositionType PVar3;
  PositionType PVar4;
  bool bVar5;
  ReferenceType __src;
  PointerType pSVar6;
  PointerType pSVar7;
  iterator iVar8;
  PositionType pos;
  SnapshotDataType local_1d0;
  undefined1 local_100 [208];
  
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  memcpy(local_100,__src,0xd0);
  memcpy(&local_1d0,local_100,0xd0);
  local_1d0.ScopeParent =
       cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(&this->SnapshotData,it,&local_1d0);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  PVar3 = (originSnapshot->Position).Position;
  (pSVar6->ScopeParent).Tree = (originSnapshot->Position).Tree;
  (pSVar6->ScopeParent).Position = PVar3;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar6->SnapshotType = VariableScopeType;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar6->Keep = false;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  PVar4 = (pSVar6->Policies).Position;
  (pSVar7->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar7->PolicyScope).Position = PVar4;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  bVar5 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (!bVar5) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x33d,
                  "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
  }
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar1 = (pSVar6->Vars).Tree;
  PVar2 = (pSVar6->Vars).Position;
  iVar8 = pSVar6->Vars;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  (pSVar6->Parent).Tree = pcVar1;
  (pSVar6->Parent).Position = PVar2;
  iVar8 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar8);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar6->Vars = iVar8;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  bVar5 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (bVar5) {
    cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_1d0.ScopeParent);
    return __return_storage_ptr__;
  }
  __assert_fail("pos->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,0x342,
                "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
}

Assistant:

cmStateSnapshot cmState::CreateVariableScopeSnapshot(
  cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::VariableScopeType;
  pos->Keep = false;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  assert(pos->Vars.IsValid());
  return cmStateSnapshot(this, pos);
}